

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.cpp
# Opt level: O2

size_t adios2::helper::GetDataTypeSize(DataType type)

{
  size_t sVar1;
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if (type - Int8 < 0xf) {
    sVar1 = *(size_t *)(&DAT_006d2d78 + (ulong)(type - Int8) * 8);
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"Helper",&local_89);
    std::__cxx11::string::string((string *)&local_48,"adiosType",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"GetDataTypeSize",&local_8b);
    std::__cxx11::string::string((string *)&local_88,"unknown data type",&local_8c);
    Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t GetDataTypeSize(DataType type)
{
#define declare_type(T)                                                                            \
    if (type == helper::GetDataType<T>())                                                          \
    {                                                                                              \
        return sizeof(T);                                                                          \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    helper::Throw<std::runtime_error>("Helper", "adiosType", "GetDataTypeSize",
                                      "unknown data type");
    return 0;
}